

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::UCharsTrieBuilder::getLimitOfLinearMatch
          (UCharsTrieBuilder *this,int32_t first,int32_t last,int32_t unitIndex)

{
  UCharsTrieElement *pUVar1;
  UCharsTrieElement *pUVar2;
  UChar UVar3;
  UChar UVar4;
  int32_t iVar5;
  bool bVar6;
  int32_t minStringLength;
  UCharsTrieElement *lastElement;
  UCharsTrieElement *firstElement;
  int32_t unitIndex_local;
  int32_t last_local;
  int32_t first_local;
  UCharsTrieBuilder *this_local;
  
  pUVar1 = this->elements;
  pUVar2 = this->elements;
  iVar5 = UCharsTrieElement::getStringLength(pUVar1 + first,&this->strings);
  firstElement._4_4_ = unitIndex;
  do {
    firstElement._4_4_ = firstElement._4_4_ + 1;
    bVar6 = false;
    if (firstElement._4_4_ < iVar5) {
      UVar3 = UCharsTrieElement::charAt(pUVar1 + first,firstElement._4_4_,&this->strings);
      UVar4 = UCharsTrieElement::charAt(pUVar2 + last,firstElement._4_4_,&this->strings);
      bVar6 = UVar3 == UVar4;
    }
  } while (bVar6);
  return firstElement._4_4_;
}

Assistant:

int32_t
UCharsTrieBuilder::getLimitOfLinearMatch(int32_t first, int32_t last, int32_t unitIndex) const {
    const UCharsTrieElement &firstElement=elements[first];
    const UCharsTrieElement &lastElement=elements[last];
    int32_t minStringLength=firstElement.getStringLength(strings);
    while(++unitIndex<minStringLength &&
            firstElement.charAt(unitIndex, strings)==
            lastElement.charAt(unitIndex, strings)) {}
    return unitIndex;
}